

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_t * cmd_ln_parse_r(ps_config_t *inout_cmdln,ps_arg_t *defn,int32 argc,char **argv,int strict)

{
  int32 iVar1;
  hash_table_t *h;
  ps_arg_t *ppVar2;
  cmd_ln_val_t *val;
  char *fmt;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ps_arg_t *val_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  void *v;
  cmd_ln_val_t *local_48;
  hash_table_t *local_40;
  ps_config_t *local_38;
  
  local_38 = inout_cmdln;
  if (inout_cmdln == (ps_config_t *)0x0) {
    inout_cmdln = ps_config_init(defn);
    inout_cmdln->defn = defn;
  }
  uVar7 = 0;
  h = hash_table_new(0x32,0);
  uVar6 = 0;
  if ((defn != (ps_arg_t *)0x0) && (pcVar5 = defn->name, pcVar5 != (char *)0x0)) {
    uVar6 = 0;
    val_00 = defn;
    do {
      ppVar2 = (ps_arg_t *)hash_table_enter(h,pcVar5,val_00);
      iVar3 = 0;
      if ((strict != 0) && (val_00 != ppVar2)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x140,"Duplicate argument name in definition: %s\n",val_00->name);
        iVar3 = 5;
      }
      if (iVar3 != 0) goto joined_r0x00115afe;
      pcVar5 = val_00[1].name;
      val_00 = val_00 + 1;
      uVar6 = uVar6 + 1;
    } while (pcVar5 != (char *)0x0);
  }
  if (0 < argc) {
    uVar7 = (uint)(**argv != '-');
  }
  local_40 = h;
  if ((int)uVar7 < argc) {
    uVar8 = (ulong)uVar7;
    do {
      pcVar5 = argv[uVar8];
      pcVar5 = pcVar5 + (ulong)(pcVar5[*pcVar5 == '-'] == '-') + (ulong)(*pcVar5 == '-');
      iVar1 = hash_table_lookup(local_40,pcVar5,&local_48);
      if (iVar1 < 0) {
        if (strict != 0) {
          lVar4 = 0x15f;
          fmt = "Unknown argument name \'%s\'\n";
          goto LAB_00115983;
        }
        iVar3 = 8;
        if (defn == (ps_arg_t *)0x0) {
          local_48 = (cmd_ln_val_t *)0x0;
          goto LAB_001158d8;
        }
      }
      else {
LAB_001158d8:
        if ((int)uVar8 + 1 < argc) {
          if (local_48 == (cmd_ln_val_t *)0x0) {
            val = cmd_ln_val_init(8,pcVar5,argv[uVar8 + 1]);
          }
          else {
            val = cmd_ln_val_init(local_48->type,pcVar5,argv[uVar8 + 1]);
            if (val == (cmd_ln_val_t *)0x0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                      ,0x173,"Bad argument value for %s: %s\n",pcVar5,argv[uVar8 + 1]);
              iVar3 = 5;
              goto LAB_00115a0b;
            }
          }
          local_48 = (cmd_ln_val_t *)hash_table_enter(inout_cmdln->ht,val->name,val);
          iVar3 = 0;
          if (local_48 != val) {
            local_48 = (cmd_ln_val_t *)hash_table_replace(inout_cmdln->ht,val->name,val);
            cmd_ln_val_free(local_48);
          }
        }
        else {
          lVar4 = 0x16b;
          fmt = "Argument value for \'%s\' missing\n";
LAB_00115983:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,lVar4,fmt,pcVar5);
          iVar3 = 5;
        }
      }
LAB_00115a0b:
      if ((iVar3 != 0) && (h = local_40, iVar3 != 8)) {
joined_r0x00115afe:
        if (iVar3 != 5) {
          return (cmd_ln_t *)defn;
        }
        if (h != (hash_table_t *)0x0) {
          hash_table_free(h);
        }
        if (local_38 == (ps_config_t *)0x0) {
          ps_config_free(inout_cmdln);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x19e,"Failed to parse arguments list\n");
        return (cmd_ln_t *)0x0;
      }
      uVar8 = uVar8 + 2;
    } while ((int)uVar8 < argc);
  }
  if (uVar6 != 0) {
    lVar4 = 0;
    do {
      if (((*(byte *)((long)&defn->type + lVar4) & 1) != 0) &&
         (iVar1 = hash_table_lookup(inout_cmdln->ht,*(char **)((long)&defn->name + lVar4),&local_48)
         , iVar1 != 0)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x186,"Missing required argument %s\n",*(undefined8 *)((long)&defn->name + lVar4));
      }
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar6 << 5 != lVar4);
  }
  if (argc == 1 && strict != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x18e,"No arguments given\n");
    if (local_40 != (hash_table_t *)0x0) {
      hash_table_free(local_40);
    }
    if (local_38 == (ps_config_t *)0x0) {
      ps_config_free(inout_cmdln);
    }
    inout_cmdln = (ps_config_t *)0x0;
  }
  else {
    hash_table_free(local_40);
  }
  return inout_cmdln;
}

Assistant:

ps_config_t *
cmd_ln_parse_r(ps_config_t *inout_cmdln, const ps_arg_t * defn,
               int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    ps_config_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = ps_config_init(defn);
        cmdln->defn = defn;
    }
    else /* FIXME: definitions should just be in the ps_config_t */
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* skip argv[0] if it doesn't start with dash (starting with a
     * dash would only happen if called from parse_options()) */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        ps_arg_t *argdef;
        cmd_ln_val_t *val;
        char *name;
        void *v;

        name = argv[j];
        if (*name && *name == '-')
            ++name;
        if (*name && *name == '-')
            ++name;
        if (hash_table_lookup(defidx, name, &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", name);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (ps_arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            E_ERROR("Argument value for '%s' missing\n", name);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, name, argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, name, argv[j + 1])) == NULL) {
                E_ERROR("Bad argument value for %s: %s\n", name, argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            v = hash_table_replace(cmdln->ht, val->name, (void *)val);
            cmd_ln_val_free((cmd_ln_val_t *)v);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given\n");
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            ps_config_free(cmdln);
        return NULL;
    }

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        ps_config_free(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}